

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.cpp
# Opt level: O3

VectorXd __thiscall RadarMeasurement::InitializeState(RadarMeasurement *this,int n)

{
  double dVar1;
  Sensor *pSVar2;
  _func_int **pp_Var3;
  double *pdVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  long lVar8;
  int in_EDX;
  DenseIndex extraout_RDX;
  undefined4 in_register_00000034;
  long lVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  VectorXd VVar14;
  Sensor *local_30 [2];
  _func_int *local_20;
  
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)this,(long)in_EDX,(long)in_EDX,1);
  if (in_EDX < 0) {
    __assert_fail("dim >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Matrix.h"
                  ,0xf0,
                  "Eigen::Matrix<double, -1, 1>::Matrix(Index) [_Scalar = double, _Rows = -1, _Cols = 1, _Options = 0, _MaxRows = -1, _MaxCols = 1]"
                 );
  }
  local_30[0] = (this->super_Measurement).sensor_;
  local_20 = (_func_int *)0x3ff0000000000000;
  if ((long)local_30[0] < 0) {
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  resizeLike<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_30);
  pSVar2 = (this->super_Measurement).sensor_;
  if (pSVar2 != local_30[0]) {
    __assert_fail("rows() == other.rows() && cols() == other.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Assign.h"
                  ,0x1f9,
                  "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>]"
                 );
  }
  uVar7 = (long)pSVar2 - ((long)pSVar2 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)pSVar2) {
    lVar9 = 0;
    do {
      pp_Var3 = (this->super_Measurement)._vptr_Measurement + lVar9;
      *pp_Var3 = local_20;
      pp_Var3[1] = local_20;
      lVar9 = lVar9 + 2;
    } while (lVar9 < (long)uVar7);
  }
  auVar6 = _DAT_00133420;
  auVar5 = _DAT_00133410;
  lVar9 = (long)pSVar2 % 2;
  if (lVar9 != 0 && (long)uVar7 <= (long)pSVar2) {
    pp_Var3 = (this->super_Measurement)._vptr_Measurement;
    lVar8 = lVar9 + -1;
    auVar12._8_4_ = (int)lVar8;
    auVar12._0_8_ = lVar8;
    auVar12._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar7 = 0;
    auVar12 = auVar12 ^ _DAT_00133420;
    do {
      auVar13._8_4_ = (int)uVar7;
      auVar13._0_8_ = uVar7;
      auVar13._12_4_ = (int)(uVar7 >> 0x20);
      auVar13 = (auVar13 | auVar5) ^ auVar6;
      if ((bool)(~(auVar13._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar13._0_4_ ||
                  auVar12._4_4_ < auVar13._4_4_) & 1)) {
        pp_Var3[((long)pSVar2 / 2) * 2 + uVar7] = local_20;
      }
      if ((auVar13._12_4_ != auVar12._12_4_ || auVar13._8_4_ <= auVar12._8_4_) &&
          auVar13._12_4_ <= auVar12._12_4_) {
        pp_Var3[((long)pSVar2 / 2) * 2 + uVar7 + 1] = local_20;
      }
      uVar7 = uVar7 + 2;
    } while ((lVar9 + 1U & 0xfffffffffffffffe) != uVar7);
  }
  lVar9 = *(long *)(CONCAT44(in_register_00000034,n) + 0x20);
  if ((0 < lVar9) && (lVar9 != 1)) {
    pdVar4 = *(double **)(CONCAT44(in_register_00000034,n) + 0x18);
    dVar1 = *pdVar4;
    dVar11 = pdVar4[1];
    dVar10 = cos(dVar11);
    if (0 < (long)(this->super_Measurement).sensor_) {
      *(this->super_Measurement)._vptr_Measurement = (_func_int *)(dVar10 * dVar1);
      dVar11 = sin(dVar11);
      if (1 < (long)(this->super_Measurement).sensor_) {
        (this->super_Measurement)._vptr_Measurement[1] = (_func_int *)(dVar1 * dVar11);
        VVar14.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             extraout_RDX;
        VVar14.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)this;
        return (VectorXd)
               VVar14.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                  ,0x18a,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                ,0x9c,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

VectorXd RadarMeasurement::InitializeState(int n) const {

    VectorXd x(n);
    // initialize the state vector
    x.fill(1.0);
    double rho = measurements_[0];
    double phi = measurements_[1];
    x(0) = rho * cos(phi);
    x(1) = rho * sin(phi);
    //x(0) = (fabs(rho)<0.001) ? 0.01 : rho * cos(phi);
    //x(1) = (fabs(rho)<0.001) ? 0.01 : rho * sin(phi);
    // TODO: redo equations here:
    // v: rho dot is actually a predo equations here:rojection of v to vector rho.  
    // psi: the is angle between vy and v
    //x(2) = measurements_[2];
    //x(3) = phi; 
    return x;
}